

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateCopyFrom
          (MessageGenerator *this,Printer *printer)

{
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,
                       "void $classname$::CopyFrom(const ::google::protobuf::Message& from) {\n// @@protoc_insertion_point(generalized_copy_from_start:$full_name$)\n"
                       ,"classname",&this->classname_,"full_name",
                       *(string **)(this->descriptor_ + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"if (&from == this) return;\nClear();\nMergeFrom(from);\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  io::Printer::Print(printer,
                     "void $classname$::CopyFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_copy_from_start:$full_name$)\n"
                     ,"classname",&this->classname_,"full_name",*(string **)(this->descriptor_ + 8))
  ;
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"if (&from == this) return;\nClear();\nMergeFrom(from);\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateCopyFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    // Generate the generalized CopyFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
        "void $classname$::CopyFrom(const ::google::protobuf::Message& from) {\n"
        "// @@protoc_insertion_point(generalized_copy_from_start:"
        "$full_name$)\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();

    printer->Print(
      "if (&from == this) return;\n"
      "Clear();\n"
      "MergeFrom(from);\n");

    printer->Outdent();
    printer->Print("}\n\n");
  }

  // Generate the class-specific CopyFrom.
  printer->Print(
      "void $classname$::CopyFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_copy_from_start:"
      "$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  printer->Print(
    "if (&from == this) return;\n"
    "Clear();\n"
    "MergeFrom(from);\n");

  printer->Outdent();
  printer->Print("}\n");
}